

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_pointer.cc
# Opt level: O2

void scoped_map(void)

{
  unsigned_long uVar1;
  bool bVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
  *this;
  MappedReference<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>,_boost::interprocess::iset_index>_>_>_>_>
  pvVar3;
  ostream *poVar4;
  long lVar5;
  initializer_list<unsigned_long> __l;
  uint local_bc;
  iterator __begin1;
  pointer local_98;
  pointer local_90;
  _Head_base<0UL,_unsigned_int_&,_false> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> init;
  pointer *local_68;
  pointer *local_60;
  managed_mapped_file mmap_file;
  
  __begin1._M_current.internal.m_offset._0_4_ = 0x1a4;
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::basic_managed_mapped_file(&mmap_file,"map_iv.dat",1000000,0,&__begin1);
  __begin1._M_current.internal =
       (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)anon_var_dwarf_1844b;
  init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)mmap_file.
                super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
                .mp_header;
  this = (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
          *)boost::interprocess::ipcdetail::
            named_proxy<boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>,phmap::flat_hash_map<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,false>
            ::operator()((named_proxy<boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>,phmap::flat_hash_map<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,false>
                          *)&__begin1,
                         (segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
                          **)&init);
  for (local_bc = 0; local_bc < 1000; local_bc = local_bc + 1) {
    __begin1._M_current.internal =
         (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)
         (offset_ptr_internal<unsigned_long,_0UL>)0x1;
    __l._M_len = 4;
    __l._M_array = (iterator)&__begin1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,__l,
               (allocator_type *)&local_68);
    local_88._M_head_impl = &local_bc;
    local_90 = init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_68 = &local_98;
    local_60 = &local_90;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
    ::
    emplace<const_std::piecewise_construct_t_&,_std::tuple<unsigned_int_&>,_std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_&&,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_&&>,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>::iterator,_bool>
                *)&__begin1,this,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<unsigned_int_&> *)&local_88,
               (tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_&&,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_&&>
                *)&local_68);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  __begin1._M_current.internal =
       (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)
       (offset_ptr_internal<unsigned_long,_0UL>)0xa;
  pvVar3 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
           ::
           at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
                       *)this,(key_arg<const_unsigned_long> *)&__begin1);
  std::
  vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  ::size(pvVar3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  __begin1._M_current.internal =
       (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)
       (offset_ptr_internal<unsigned_long,_0UL>)0xa;
  pvVar3 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
           ::
           at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
                       *)this,(key_arg<const_unsigned_long> *)&__begin1);
  uVar1 = (pvVar3->
          super__Vector_base<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          )._M_impl.super__Vector_impl_data._M_start.internal.m_offset;
  lVar5 = (long)pvVar3 + (8 - (long)&__begin1);
  if (uVar1 == 1) {
    lVar5 = 0;
  }
  __begin1._M_current.internal =
       (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)(lVar5 + uVar1);
  uVar1 = (pvVar3->
          super__Vector_base<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          )._M_impl.super__Vector_impl_data._M_finish.internal.m_offset;
  lVar5 = (long)pvVar3 +
          (0x10 - (long)&init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  if (uVar1 == 1) {
    lVar5 = 0;
  }
  init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(lVar5 + uVar1);
  while (bVar2 = boost::interprocess::operator!=
                           (&__begin1._M_current,
                            (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL> *)
                            &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
        , bVar2) {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar4," ");
    __begin1._M_current.internal =
         (offset_ptr<unsigned_long,_long,_unsigned_long,_0UL>)
         ((long)__begin1._M_current.internal + 8);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::~basic_managed_mapped_file(&mmap_file);
  return;
}

Assistant:

void scoped_map() {
   using way_t           = std::vector<uint64_t, bi_alloc_t<uint64_t>>;
   using waystore_pair_t = std::pair<const uint64_t, way_t>;
   using map_t           = phmap::flat_hash_map<const uint64_t, way_t, std::hash<uint64_t>, std::equal_to<uint64_t>,
                                                std::scoped_allocator_adaptor<bi_alloc_t<waystore_pair_t>>>;

   auto mmap_file =
      boost::interprocess::managed_mapped_file(boost::interprocess::open_or_create, "map_iv.dat", 1000000);
   map_t* map = mmap_file.find_or_construct<map_t>("ways_store")(mmap_file.get_segment_manager());

   for (unsigned int i = 0; i < 1000; ++i) {
      std::vector<uint64_t> init = {1, 2, 3, 4};
      map->emplace(std::piecewise_construct, std::forward_as_tuple(i), std::forward_as_tuple(init.begin(), init.end()));
   }

   std::cout << map->at(10).size() << std::endl;
   for (auto const& i : map->at(10))
      std::cout << i << " ";
   std::cout << std::endl;
}